

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_fuzz(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  undefined4 *puVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  uint8_t *child;
  bson_iter_t iter;
  uint local_18c;
  uint *local_188;
  undefined1 local_180 [8];
  uint local_178;
  int local_174;
  uint local_158;
  
  iVar9 = 0;
  do {
    if (iVar9 == 100000) {
      return;
    }
    puVar4 = (undefined4 *)bson_malloc0(0x200);
    *puVar4 = 0x200;
    for (uVar8 = 4; uVar8 < 0x200; uVar8 = uVar8 + 4) {
      iVar2 = rand();
      *(int *)((long)puVar4 + uVar8) = iVar2;
    }
    lVar5 = bson_new_from_data(puVar4,0x200);
    if (lVar5 != 0) {
      cVar1 = bson_iter_init(local_180,lVar5);
      if (cVar1 == '\0') {
        pcVar7 = "bson_iter_init (&iter, b)";
        uVar6 = 0xf9;
LAB_00119c32:
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c"
                ,uVar6,"test_bson_iter_fuzz",pcVar7);
        abort();
      }
LAB_00119afa:
      cVar1 = bson_iter_next(local_180);
      if (cVar1 != '\0') {
        if (local_158 < 0x200) {
          uVar3 = bson_iter_type(local_180);
          if (uVar3 < 0x14) break;
          goto LAB_00119bc7;
        }
        pcVar7 = "iter.next_off < len";
        uVar6 = 0xfb;
        goto LAB_00119c32;
      }
      bson_destroy(lVar5);
    }
    bson_free(puVar4);
    iVar9 = iVar9 + 1;
  } while( true );
  if ((0xfff66U >> (uVar3 & 0x1f) & 1) == 0) {
    if ((0x18U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 7) {
        if (local_178 <= local_174 + 0xcU) {
          pcVar7 = "iter.off + 12 < iter.len";
          uVar6 = 0x113;
          goto LAB_00119c32;
        }
      }
      else {
LAB_00119bc7:
        if ((uVar3 != 0x7f) && (uVar3 != 0xff)) {
          pcVar7 = "false";
          uVar6 = 0x128;
          goto LAB_00119c32;
        }
      }
    }
    else {
      local_188 = (uint *)0x0;
      local_18c = 0;
      bson_iter_document(local_180,&local_18c,&local_188);
      if (local_18c != 0) {
        if (local_188 == (uint *)0x0) {
          pcVar7 = "child";
          uVar6 = 0x104;
          goto LAB_00119c32;
        }
        if (local_18c < 5) {
          pcVar7 = "child_len >= 5";
          uVar6 = 0x105;
          goto LAB_00119c32;
        }
        if (*(uint *)(lVar5 + 4) <= local_174 + local_18c) {
          pcVar7 = "(iter.off + child_len) < b->len";
          uVar6 = 0x106;
          goto LAB_00119c32;
        }
        if (local_18c == 0xffffffff) {
          pcVar7 = "child_len < (uint32_t) -1";
          uVar6 = 0x107;
          goto LAB_00119c32;
        }
        local_18c = *local_188;
        if (local_18c < 5) {
          pcVar7 = "child_len >= 5";
          uVar6 = 0x10a;
          goto LAB_00119c32;
        }
      }
    }
  }
  goto LAB_00119afa;
}

Assistant:

static void
test_bson_iter_fuzz (void)
{
   uint8_t *data;
   uint32_t len = 512;
   uint32_t len_le;
   uint32_t r;
   bson_iter_t iter;
   bson_t *b;
   uint32_t i;
   int pass;

   len_le = BSON_UINT32_TO_LE (len);

   for (pass = 0; pass < FUZZ_N_PASSES; pass++) {
      data = bson_malloc0 (len);
      memcpy (data, &len_le, sizeof (len_le));

      for (i = 4; i < len; i += 4) {
         r = rand ();
         memcpy (&data[i], &r, sizeof (r));
      }

      if (!(b = bson_new_from_data (data, len))) {
         /*
          * It could fail on buffer length or missing trailing null byte.
          */
         bson_free (data);
         continue;
      }

      BSON_ASSERT (b);

      /*
       * TODO: Most of the following ignores the key. That should be fixed
       *       but has it's own perils too.
       */

      BSON_ASSERT (bson_iter_init (&iter, b));
      while (bson_iter_next (&iter)) {
         BSON_ASSERT (iter.next_off < len);
         switch (bson_iter_type (&iter)) {
         case BSON_TYPE_ARRAY:
         case BSON_TYPE_DOCUMENT: {
            const uint8_t *child = NULL;
            uint32_t child_len = 0;

            bson_iter_document (&iter, &child_len, &child);
            if (child_len) {
               BSON_ASSERT (child);
               BSON_ASSERT (child_len >= 5);
               BSON_ASSERT ((iter.off + child_len) < b->len);
               BSON_ASSERT (child_len < (uint32_t) -1);
               memcpy (&child_len, child, sizeof (child_len));
               child_len = BSON_UINT32_FROM_LE (child_len);
               BSON_ASSERT (child_len >= 5);
            }
         } break;
         case BSON_TYPE_DOUBLE:
         case BSON_TYPE_UTF8:
         case BSON_TYPE_BINARY:
         case BSON_TYPE_UNDEFINED:
            break;
         case BSON_TYPE_OID:
            BSON_ASSERT (iter.off + 12 < iter.len);
            break;
         case BSON_TYPE_BOOL:
         case BSON_TYPE_DATE_TIME:
         case BSON_TYPE_NULL:
         case BSON_TYPE_REGEX:
         /* TODO: check for 2 valid cstring. */
         case BSON_TYPE_DBPOINTER:
         case BSON_TYPE_CODE:
         case BSON_TYPE_SYMBOL:
         case BSON_TYPE_CODEWSCOPE:
         case BSON_TYPE_INT32:
         case BSON_TYPE_TIMESTAMP:
         case BSON_TYPE_INT64:
         case BSON_TYPE_DECIMAL128:
         case BSON_TYPE_MAXKEY:
         case BSON_TYPE_MINKEY:
            break;
         case BSON_TYPE_EOD:
         default:
            /* Code should not be reached. */
            BSON_ASSERT (false);
            break;
         }
      }

      bson_destroy (b);
      bson_free (data);
   }
}